

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O2

void __thiscall
UEFIToolApplication::UEFIToolApplication(UEFIToolApplication *this,int *argc,char **argv)

{
  UEFITool *this_00;
  QArrayDataPointer<char16_t> local_30;
  
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_00280450;
  QString::QString((QString *)&local_30,"CodeRush");
  QCoreApplication::setOrganizationName((QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QString::QString((QString *)&local_30,"coderush.me");
  QCoreApplication::setOrganizationDomain((QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QString::QString((QString *)&local_30,"UEFITool");
  QCoreApplication::setApplicationName((QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QString::QString((QString *)&local_30,"uefitool");
  QGuiApplication::setDesktopFileName((QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  this_00 = (UEFITool *)operator_new(0x100);
  UEFITool::UEFITool(this_00,(QWidget *)0x0);
  this->tool = this_00;
  return;
}

Assistant:

UEFIToolApplication(int &argc, char **argv)
    : QApplication(argc, argv)
    {
        setOrganizationName("CodeRush");
        setOrganizationDomain("coderush.me");
        setApplicationName("UEFITool");
#if QT_VERSION >= QT_VERSION_CHECK(5, 7, 0)
        setDesktopFileName("uefitool");
#endif
        tool = new UEFITool();
    }